

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinstats.cpp
# Opt level: O2

void kernel::TxOutSer<DataStream>(DataStream *ss,COutPoint *outpoint,Coin *coin)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  COutPoint::SerializationOps<DataStream,COutPoint_const,ActionSerialize>(outpoint,ss);
  ser_writedata32<DataStream>(ss,*(uint32_t *)&coin->field_0x28);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    CTxOut::SerializationOps<DataStream,CTxOut_const,ActionSerialize>(coin,ss);
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void TxOutSer(T& ss, const COutPoint& outpoint, const Coin& coin)
{
    ss << outpoint;
    ss << static_cast<uint32_t>((coin.nHeight << 1) + coin.fCoinBase);
    ss << coin.out;
}